

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O0

ostream * vk::operator<<(ostream *str,AllocationCallbackViolation *violation)

{
  Hex<16UL> HVar1;
  ostream *poVar2;
  Hex<8UL> hex;
  AllocationCallbackViolation *violation_local;
  ostream *str_local;
  
  switch(violation->reason) {
  case REASON_DOUBLE_FREE:
    poVar2 = std::operator<<(str,"Double free of ");
    HVar1 = tcu::toHex<void_*>((violation->record).data.reallocation.original);
    tcu::Format::operator<<(poVar2,HVar1);
    break;
  case REASON_FREE_NOT_ALLOCATED_PTR:
    poVar2 = std::operator<<(str,"Attempt to free ");
    HVar1 = tcu::toHex<void_*>((violation->record).data.reallocation.original);
    poVar2 = tcu::Format::operator<<(poVar2,HVar1);
    std::operator<<(poVar2," which has not been allocated");
    break;
  case REASON_REALLOC_NOT_ALLOCATED_PTR:
    poVar2 = std::operator<<(str,"Attempt to reallocate ");
    HVar1 = tcu::toHex<void_*>((violation->record).data.reallocation.original);
    poVar2 = tcu::Format::operator<<(poVar2,HVar1);
    std::operator<<(poVar2," which has not been allocated");
    break;
  case REASON_REALLOC_FREED_PTR:
    poVar2 = std::operator<<(str,"Attempt to reallocate ");
    HVar1 = tcu::toHex<void_*>((violation->record).data.reallocation.original);
    poVar2 = tcu::Format::operator<<(poVar2,HVar1);
    std::operator<<(poVar2," which has been freed");
    break;
  case REASON_NEGATIVE_INTERNAL_ALLOCATION_TOTAL:
    poVar2 = std::operator<<(str,"Internal allocation total for (");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,(violation->record).data.internalAllocation.type);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,(violation->record).data.internalAllocation.scope);
    std::operator<<(poVar2,") is negative");
    break;
  case REASON_INVALID_ALLOCATION_SCOPE:
    std::operator<<(str,"Invalid allocation scope");
    break;
  case REASON_INVALID_INTERNAL_ALLOCATION_TYPE:
    poVar2 = std::operator<<(str,"Invalid internal allocation type ");
    hex = tcu::toHex<vk::VkInternalAllocationType>((violation->record).data.internalAllocation.type)
    ;
    tcu::Format::operator<<(poVar2,hex);
    break;
  case REASON_INVALID_ALIGNMENT:
    std::operator<<(str,"Invalid alignment");
    break;
  case REASON_REALLOC_DIFFERENT_ALIGNMENT:
    std::operator<<(str,"Reallocation with different alignment");
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const AllocationCallbackViolation& violation)
{
	switch (violation.reason)
	{
		case AllocationCallbackViolation::REASON_DOUBLE_FREE:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_FREE);
			str << "Double free of " << tcu::toHex(violation.record.data.free.mem);
			break;
		}

		case AllocationCallbackViolation::REASON_FREE_NOT_ALLOCATED_PTR:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_FREE);
			str << "Attempt to free " << tcu::toHex(violation.record.data.free.mem) << " which has not been allocated";
			break;
		}

		case AllocationCallbackViolation::REASON_REALLOC_NOT_ALLOCATED_PTR:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_REALLOCATION);
			str << "Attempt to reallocate " << tcu::toHex(violation.record.data.reallocation.original) << " which has not been allocated";
			break;
		}

		case AllocationCallbackViolation::REASON_REALLOC_FREED_PTR:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_REALLOCATION);
			str << "Attempt to reallocate " << tcu::toHex(violation.record.data.reallocation.original) << " which has been freed";
			break;
		}

		case AllocationCallbackViolation::REASON_NEGATIVE_INTERNAL_ALLOCATION_TOTAL:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE);
			str << "Internal allocation total for (" << violation.record.data.internalAllocation.type << ", " << violation.record.data.internalAllocation.scope << ") is negative";
			break;
		}

		case AllocationCallbackViolation::REASON_INVALID_INTERNAL_ALLOCATION_TYPE:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION ||
					  violation.record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE);
			str << "Invalid internal allocation type " << tcu::toHex(violation.record.data.internalAllocation.type);
			break;
		}

		case AllocationCallbackViolation::REASON_INVALID_ALLOCATION_SCOPE:
		{
			str << "Invalid allocation scope";
			break;
		}

		case AllocationCallbackViolation::REASON_INVALID_ALIGNMENT:
		{
			str << "Invalid alignment";
			break;
		}

		case AllocationCallbackViolation::REASON_REALLOC_DIFFERENT_ALIGNMENT:
		{
			str << "Reallocation with different alignment";
			break;
		}

		default:
			DE_ASSERT(false);
	}

	return str;
}